

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_PNGFilter.cc
# Opt level: O0

ssize_t __thiscall Pl_PNGFilter::write(Pl_PNGFilter *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  element_type *local_48;
  uchar *t;
  size_t offset;
  size_t left;
  size_t len_local;
  uchar *data_local;
  Pl_PNGFilter *this_local;
  
  offset = this->incoming - this->pos;
  t = (uchar *)0x0;
  left = (size_t)__buf;
  while (offset <= left) {
    memcpy(this->cur_row + this->pos,t + CONCAT44(in_register_00000034,__fd),offset);
    t = t + offset;
    left = left - offset;
    processRow(this);
    local_48 = this->prev_row;
    this->prev_row = this->cur_row;
    if (local_48 == (element_type *)0x0) {
      local_48 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                           (&(this->buf2).
                             super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>);
    }
    this->cur_row = local_48;
    memset(this->cur_row,0,(ulong)(this->bytes_per_row + 1));
    offset = this->incoming;
    this->pos = 0;
  }
  if (left != 0) {
    memcpy(this->cur_row + this->pos,t + CONCAT44(in_register_00000034,__fd),left);
  }
  this->pos = left + this->pos;
  return (ssize_t)this;
}

Assistant:

void
Pl_PNGFilter::write(unsigned char const* data, size_t len)
{
    size_t left = this->incoming - this->pos;
    size_t offset = 0;
    while (len >= left) {
        // finish off current row
        memcpy(this->cur_row + this->pos, data + offset, left);
        offset += left;
        len -= left;

        processRow();

        // Swap rows
        unsigned char* t = this->prev_row;
        this->prev_row = this->cur_row;
        this->cur_row = t ? t : this->buf2.get();
        memset(this->cur_row, 0, this->bytes_per_row + 1);
        left = this->incoming;
        this->pos = 0;
    }
    if (len) {
        memcpy(this->cur_row + this->pos, data + offset, len);
    }
    this->pos += len;
}